

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# event.c
# Opt level: O0

event_base * event_base_new_with_config(event_config *cfg)

{
  int iVar1;
  char *pcVar2;
  void *pvVar3;
  bool bVar4;
  void *local_60;
  void *local_58;
  bool local_4d;
  int r;
  int flags;
  int precise_time;
  timeval tmp;
  int should_check_environment;
  event_base *base;
  int i;
  event_config *cfg_local;
  
  event_debug_mode_too_late = 1;
  cfg_local = (event_config *)event_mm_calloc_(1,0x298);
  if ((event_base *)cfg_local == (event_base *)0x0) {
    event_warn("%s: calloc","event_base_new_with_config");
    return (event_base *)0x0;
  }
  if (cfg != (event_config *)0x0) {
    ((event_base *)cfg_local)->flags = cfg->flags;
  }
  local_4d = false;
  if (cfg != (event_config *)0x0) {
    local_4d = (cfg->flags & EVENT_BASE_FLAG_IGNORE_ENV) != 0;
  }
  tmp.tv_usec._4_4_ = (uint)((local_4d ^ 0xffU) & 1);
  bVar4 = false;
  if (cfg != (event_config *)0x0) {
    bVar4 = (cfg->flags & EVENT_BASE_FLAG_PRECISE_TIMER) != 0;
  }
  if ((tmp.tv_usec._4_4_ != 0) && (!bVar4)) {
    pcVar2 = evutil_getenv_("EVENT_PRECISE_TIMER");
    bVar4 = pcVar2 != (char *)0x0;
    if (bVar4) {
      ((event_base *)cfg_local)->flags =
           ((event_base *)cfg_local)->flags | EVENT_BASE_FLAG_PRECISE_TIMER;
    }
  }
  evutil_configure_monotonic_time_(&((event_base *)cfg_local)->monotonic_timer,(uint)bVar4);
  gettime((event_base *)cfg_local,(timeval *)&flags);
  min_heap_ctor_(&((event_base *)cfg_local)->timeheap);
  (((event_base *)cfg_local)->sig).ev_signal_pair[0] = -1;
  (((event_base *)cfg_local)->sig).ev_signal_pair[1] = -1;
  ((event_base *)cfg_local)->th_notify_fd[0] = -1;
  ((event_base *)cfg_local)->th_notify_fd[1] = -1;
  (((event_base *)cfg_local)->active_later_queue).tqh_first = (event_callback *)0x0;
  (((event_base *)cfg_local)->active_later_queue).tqh_last =
       &(((event_base *)cfg_local)->active_later_queue).tqh_first;
  evmap_io_initmap_(&((event_base *)cfg_local)->io);
  evmap_signal_initmap_(&((event_base *)cfg_local)->sigmap);
  event_changelist_init_(&((event_base *)cfg_local)->changelist);
  ((event_base *)cfg_local)->evbase = (void *)0x0;
  if (cfg == (event_config *)0x0) {
    (((event_base *)cfg_local)->max_dispatch_time).tv_sec = -1;
    ((event_base *)cfg_local)->limit_callbacks_after_prio = 1;
  }
  else {
    (((event_base *)cfg_local)->max_dispatch_time).tv_sec = (cfg->max_dispatch_interval).tv_sec;
    (((event_base *)cfg_local)->max_dispatch_time).tv_usec = (cfg->max_dispatch_interval).tv_usec;
    ((event_base *)cfg_local)->limit_callbacks_after_prio = cfg->limit_callbacks_after_prio;
    if (-1 < cfg->max_dispatch_callbacks) {
      ((event_base *)cfg_local)->max_dispatch_callbacks = cfg->max_dispatch_callbacks;
      goto LAB_002efc21;
    }
  }
  ((event_base *)cfg_local)->max_dispatch_callbacks = 0x7fffffff;
LAB_002efc21:
  if ((((event_base *)cfg_local)->max_dispatch_callbacks == 0x7fffffff) &&
     ((((event_base *)cfg_local)->max_dispatch_time).tv_sec == -1)) {
    ((event_base *)cfg_local)->limit_callbacks_after_prio = 0x7fffffff;
  }
  base._4_4_ = 0;
  while( true ) {
    bVar4 = false;
    if (eventops[base._4_4_] != (eventop *)0x0) {
      bVar4 = ((event_base *)cfg_local)->evbase == (void *)0x0;
    }
    if (!bVar4) break;
    if (((cfg == (event_config *)0x0) ||
        ((iVar1 = event_config_is_avoided_method(cfg,eventops[base._4_4_]->name), iVar1 == 0 &&
         ((eventops[base._4_4_]->features & cfg->require_features) == cfg->require_features)))) &&
       ((tmp.tv_usec._4_4_ == 0 ||
        (iVar1 = event_is_method_disabled(eventops[base._4_4_]->name), iVar1 == 0)))) {
      ((event_base *)cfg_local)->evsel = eventops[base._4_4_];
      pvVar3 = (*((event_base *)cfg_local)->evsel->init)((event_base *)cfg_local);
      ((event_base *)cfg_local)->evbase = pvVar3;
    }
    base._4_4_ = base._4_4_ + 1;
  }
  if (((event_base *)cfg_local)->evbase == (void *)0x0) {
    event_warnx("%s: no event mechanism available","event_base_new_with_config");
    ((event_base *)cfg_local)->evsel = (eventop *)0x0;
    event_base_free((event_base *)cfg_local);
    cfg_local = (event_config *)0x0;
  }
  else {
    pcVar2 = evutil_getenv_("EVENT_SHOW_METHOD");
    if (pcVar2 != (char *)0x0) {
      event_msgx("libevent using: %s",((event_base *)cfg_local)->evsel->name);
    }
    iVar1 = event_base_priority_init((event_base *)cfg_local,1);
    if (iVar1 < 0) {
      event_base_free((event_base *)cfg_local);
      cfg_local = (event_config *)0x0;
    }
    else {
      event_debug_created_threadable_ctx_ = 1;
      if ((evthread_lock_fns_.lock != (_func_int_uint_void_ptr *)0x0) &&
         ((cfg == (event_config *)0x0 || ((cfg->flags & EVENT_BASE_FLAG_NOLOCK) == 0)))) {
        if (evthread_lock_fns_.alloc == (_func_void_ptr_uint *)0x0) {
          local_58 = (void *)0x0;
        }
        else {
          local_58 = (*evthread_lock_fns_.alloc)(0);
        }
        ((event_base *)cfg_local)->th_base_lock = local_58;
        if (evthread_cond_fns_.alloc_condition == (_func_void_ptr_uint *)0x0) {
          local_60 = (void *)0x0;
        }
        else {
          local_60 = (*evthread_cond_fns_.alloc_condition)(0);
        }
        ((event_base *)cfg_local)->current_event_cond = local_60;
        iVar1 = evthread_make_base_notifiable((event_base *)cfg_local);
        if (iVar1 < 0) {
          event_warnx("%s: Unable to make base notifiable.","event_base_new_with_config");
          event_base_free((event_base *)cfg_local);
          cfg_local = (event_config *)0x0;
        }
      }
    }
  }
  return (event_base *)cfg_local;
}

Assistant:

struct event_base *
event_base_new_with_config(const struct event_config *cfg)
{
	int i;
	struct event_base *base;
	int should_check_environment;

#ifndef EVENT__DISABLE_DEBUG_MODE
	event_debug_mode_too_late = 1;
#endif

	if ((base = mm_calloc(1, sizeof(struct event_base))) == NULL) {
		event_warn("%s: calloc", __func__);
		return NULL;
	}

	if (cfg)
		base->flags = cfg->flags;

	should_check_environment =
	    !(cfg && (cfg->flags & EVENT_BASE_FLAG_IGNORE_ENV));

	{
		struct timeval tmp;
		int precise_time =
		    cfg && (cfg->flags & EVENT_BASE_FLAG_PRECISE_TIMER);
		int flags;
		if (should_check_environment && !precise_time) {
			precise_time = evutil_getenv_("EVENT_PRECISE_TIMER") != NULL;
			if (precise_time) {
				base->flags |= EVENT_BASE_FLAG_PRECISE_TIMER;
			}
		}
		flags = precise_time ? EV_MONOT_PRECISE : 0;
		evutil_configure_monotonic_time_(&base->monotonic_timer, flags);

		gettime(base, &tmp);
	}

	min_heap_ctor_(&base->timeheap);

	base->sig.ev_signal_pair[0] = -1;
	base->sig.ev_signal_pair[1] = -1;
	base->th_notify_fd[0] = -1;
	base->th_notify_fd[1] = -1;

	TAILQ_INIT(&base->active_later_queue);

	evmap_io_initmap_(&base->io);
	evmap_signal_initmap_(&base->sigmap);
	event_changelist_init_(&base->changelist);

	base->evbase = NULL;

	if (cfg) {
		memcpy(&base->max_dispatch_time,
		    &cfg->max_dispatch_interval, sizeof(struct timeval));
		base->limit_callbacks_after_prio =
		    cfg->limit_callbacks_after_prio;
	} else {
		base->max_dispatch_time.tv_sec = -1;
		base->limit_callbacks_after_prio = 1;
	}
	if (cfg && cfg->max_dispatch_callbacks >= 0) {
		base->max_dispatch_callbacks = cfg->max_dispatch_callbacks;
	} else {
		base->max_dispatch_callbacks = INT_MAX;
	}
	if (base->max_dispatch_callbacks == INT_MAX &&
	    base->max_dispatch_time.tv_sec == -1)
		base->limit_callbacks_after_prio = INT_MAX;

	for (i = 0; eventops[i] && !base->evbase; i++) {
		if (cfg != NULL) {
			/* determine if this backend should be avoided */
			if (event_config_is_avoided_method(cfg,
				eventops[i]->name))
				continue;
			if ((eventops[i]->features & cfg->require_features)
			    != cfg->require_features)
				continue;
		}

		/* also obey the environment variables */
		if (should_check_environment &&
		    event_is_method_disabled(eventops[i]->name))
			continue;

		base->evsel = eventops[i];

		base->evbase = base->evsel->init(base);
	}

	if (base->evbase == NULL) {
		event_warnx("%s: no event mechanism available",
		    __func__);
		base->evsel = NULL;
		event_base_free(base);
		return NULL;
	}

	if (evutil_getenv_("EVENT_SHOW_METHOD"))
		event_msgx("libevent using: %s", base->evsel->name);

	/* allocate a single active event queue */
	if (event_base_priority_init(base, 1) < 0) {
		event_base_free(base);
		return NULL;
	}

	/* prepare for threading */

#if !defined(EVENT__DISABLE_THREAD_SUPPORT) && !defined(EVENT__DISABLE_DEBUG_MODE)
	event_debug_created_threadable_ctx_ = 1;
#endif

#ifndef EVENT__DISABLE_THREAD_SUPPORT
	if (EVTHREAD_LOCKING_ENABLED() &&
	    (!cfg || !(cfg->flags & EVENT_BASE_FLAG_NOLOCK))) {
		int r;
		EVTHREAD_ALLOC_LOCK(base->th_base_lock, 0);
		EVTHREAD_ALLOC_COND(base->current_event_cond);
		r = evthread_make_base_notifiable(base);
		if (r<0) {
			event_warnx("%s: Unable to make base notifiable.", __func__);
			event_base_free(base);
			return NULL;
		}
	}
#endif

#ifdef _WIN32
	if (cfg && (cfg->flags & EVENT_BASE_FLAG_STARTUP_IOCP))
		event_base_start_iocp_(base, cfg->n_cpus_hint);
#endif

	return (base);
}